

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O0

string * __thiscall ZXing::Content::text_abi_cxx11_(Content *this,TextMode mode)

{
  string_view utf8;
  string_view gs1;
  ContentType CVar1;
  ulong uVar2;
  undefined1 in_DL;
  string *in_RDI;
  string hri;
  string plain;
  string *local_110;
  string local_d8 [8];
  string_view in_stack_ffffffffffffff30;
  ByteArray *in_stack_ffffffffffffff48;
  string local_a8 [24];
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  bool withECI;
  Content *in_stack_ffffffffffffff88;
  string local_58 [32];
  string local_38 [24];
  undefined7 in_stack_ffffffffffffffe0;
  TextMode in_stack_ffffffffffffffe7;
  undefined7 in_stack_ffffffffffffffe8;
  
  withECI = SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0);
  switch(in_DL) {
  case 0:
    render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
    break;
  case 1:
    render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
    break;
  case 2:
    CVar1 = type(in_stack_ffffffffffffff88);
    if (CVar1 == Text) {
      render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
    }
    else if (CVar1 == GS1) {
      render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_38);
      gs1._M_len._7_1_ = in_stack_ffffffffffffffe7;
      gs1._M_len._0_7_ = in_stack_ffffffffffffffe0;
      gs1._M_str._0_7_ = in_stack_ffffffffffffffe8;
      gs1._M_str._7_1_ = in_DL;
      HRIFromGS1_abi_cxx11_(gs1);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        local_110 = local_58;
      }
      else {
        local_110 = local_38;
      }
      std::__cxx11::string::string((string *)in_RDI,local_110);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
    }
    else if (CVar1 == ISO15434) {
      render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
      std::__cxx11::string::operator_cast_to_basic_string_view(local_a8);
      HRIFromISO15434_abi_cxx11_(in_stack_ffffffffffffff30);
      std::__cxx11::string::~string(local_a8);
    }
    else {
      text_abi_cxx11_((Content *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe7
                     );
    }
    break;
  case 3:
    ToHex_abi_cxx11_(in_stack_ffffffffffffff48);
    break;
  case 4:
    render_abi_cxx11_(in_stack_ffffffffffffff88,withECI);
    std::__cxx11::string::operator_cast_to_basic_string_view(local_d8);
    utf8._M_str = in_stack_ffffffffffffff78;
    utf8._M_len = in_stack_ffffffffffffff70;
    EscapeNonGraphical_abi_cxx11_(utf8);
    std::__cxx11::string::~string(local_d8);
    break;
  default:
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Content::text(TextMode mode) const
{
	switch (mode) {
	case TextMode::Plain: return render(false);
	case TextMode::ECI: return render(true);
	case TextMode::HRI:
		switch (type()) {
		case ContentType::GS1: {
			auto plain = render(false);
			auto hri = HRIFromGS1(plain);
			return hri.empty() ? plain : hri;
		}
		case ContentType::ISO15434: return HRIFromISO15434(render(false));
		case ContentType::Text: return render(false);
		default: return text(TextMode::Escaped);
		}
	case TextMode::Hex: return ToHex(bytes);
	case TextMode::Escaped: return EscapeNonGraphical(render(false));
	}

	return {}; // silence compiler warning
}